

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_bool nk_button_pop_behavior(nk_context *ctx)

{
  int iVar1;
  nk_bool nVar2;
  uint uVar3;
  
  nVar2 = 0;
  if ((ctx != (nk_context *)0x0) && (iVar1 = (ctx->stacks).button_behaviors.head, 0 < iVar1)) {
    uVar3 = iVar1 - 1;
    (ctx->stacks).button_behaviors.head = uVar3;
    *(ctx->stacks).button_behaviors.elements[uVar3].address =
         (ctx->stacks).button_behaviors.elements[uVar3].old_value;
    nVar2 = 1;
  }
  return nVar2;
}

Assistant:

NK_API nk_bool
nk_button_pop_behavior(struct nk_context *ctx)
{
struct nk_config_stack_button_behavior *button_stack;
struct nk_config_stack_button_behavior_element *element;

NK_ASSERT(ctx);
if (!ctx) return 0;

button_stack = &ctx->stacks.button_behaviors;
NK_ASSERT(button_stack->head > 0);
if (button_stack->head < 1)
return 0;

element = &button_stack->elements[--button_stack->head];
*element->address = element->old_value;
return 1;
}